

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParameterErrorsTest::iterate
          (GetAttachmentParameterErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType ctxType;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint return_values_dummy_storage [4];
  long lVar10;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar9);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar10 + 0x910))(this->m_fbo_invalid,0x8ce0,0x8211,return_values_dummy_storage);
    bVar1 = ExpectError(this,0x502,"GetNamedFramebufferAttachmentParameteriv",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar10 + 0x910))(this->m_fbo_valid,0x8ce0,0x8cd2,return_values_dummy_storage);
    bVar2 = ExpectError(this,0x500,"GetNamedFramebufferAttachmentParameteriv",
                        "pname is not valid for the value of GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, as described above."
                       );
    (**(code **)(lVar10 + 0x910))
              (this->m_fbo_valid,this->m_attachment_invalid,0x8211,return_values_dummy_storage);
    bVar3 = ExpectError(this,0x500,"GetNamedFramebufferAttachmentParameteriv",
                        "attachment is not one of the accepted framebuffer attachment points, as described in specification."
                       );
    (**(code **)(lVar10 + 0x910))(this->m_fbo_valid,0x8ce1,0x8211,return_values_dummy_storage);
    bVar4 = ExpectError(this,0x502,"GetNamedFramebufferAttachmentParameteriv",
                        "the value of FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE is GL_NONE and pname is not FRAMEBUFFER_ATTACHMENT_OBJECT_NAME or FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE."
                       );
    (**(code **)(lVar10 + 0x910))(this->m_fbo_valid,0x821a,0x8211,return_values_dummy_storage);
    bVar5 = ExpectError(this,0x502,"GetNamedFramebufferAttachmentParameteriv",
                        "attachment is DEPTH_STENCIL_ATTACHMENT and pname is FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE."
                       );
    (**(code **)(lVar10 + 0x910))
              (0,this->m_default_attachment_invalid,0x8211,return_values_dummy_storage);
    bVar6 = ExpectError(this,0x500,"GetNamedFramebufferAttachmentParameteriv",
                        "the default framebuffer is queried and attachment is not one the values FRONT, FRONT_LEFT, FRONT_RIGHT, BACK, BACK_LEFT, BACK_RIGHT, DEPTH, STENCIL."
                       );
    (**(code **)(lVar10 + 0x910))
              (this->m_fbo_valid,this->m_max_color_attachments + 0x8ce0,0x8211,
               return_values_dummy_storage);
    bVar7 = ExpectError(this,0x502,"GetNamedFramebufferAttachmentParameteriv",
                        "a framebuffer object is bound to target and attachment is COLOR_ATTACHMENTm where m is equal to the value of MAX_COLOR_ATTACHMENTS."
                       );
    (**(code **)(lVar10 + 0x910))
              (this->m_fbo_valid,this->m_max_color_attachments + 0x8ce1,0x8211,
               return_values_dummy_storage);
    bVar8 = ExpectError(this,0x502,"GetNamedFramebufferAttachmentParameteriv",
                        "a framebuffer object is bound to target and attachment is COLOR_ATTACHMENTm where m is greater than the value of MAX_COLOR_ATTACHMENTS."
                       );
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) && bVar8) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetAttachmentParameterErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		glw::GLint return_values_dummy_storage[4];

		/*  Check that GL_INVALID_OPERATION is generated by
		 GetNamedFramebufferAttachmentParameteriv if framebuffer is not zero or
		 the name of an existing framebuffer object. */
		gl.getNamedFramebufferAttachmentParameteriv(
			m_fbo_invalid, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, return_values_dummy_storage);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "GetNamedFramebufferAttachmentParameteriv",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		/*  Check that INVALID_ENUM is generated by
		 GetNamedFramebufferAttachmentParameteriv if pname is not valid for the
		 value of GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, as described above. */
		gl.getNamedFramebufferAttachmentParameteriv(
			m_fbo_valid, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, return_values_dummy_storage);

		is_ok &= ExpectError(
			GL_INVALID_ENUM, "GetNamedFramebufferAttachmentParameteriv",
			"pname is not valid for the value of GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, as described above.");

		/*  Check that INVALID_ENUM error is generated if a framebuffer object is queried, attachment
		 is not one of the attachments in table 9.2 (COLOR_ATTACHMENTi, DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, DEPTH_STENCIL_ATTACHMENT), and attachment is not
		 COLOR_ATTACHMENTm where m is greater than or equal to the value of MAX_COLOR_ATTACHMENTS. */
		gl.getNamedFramebufferAttachmentParameteriv(
			m_fbo_valid, m_attachment_invalid, GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, return_values_dummy_storage);

		is_ok &= ExpectError(
			GL_INVALID_ENUM, "GetNamedFramebufferAttachmentParameteriv",
			"attachment is not one of the accepted framebuffer attachment points, as described in specification.");

		/*  Check that INVALID_OPERATION is generated by
		 GetNamedFramebufferAttachmentParameteriv if the value of
		 FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE is GL_NONE and pname is not
		 FRAMEBUFFER_ATTACHMENT_OBJECT_NAME or
		 FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE. */
		gl.getNamedFramebufferAttachmentParameteriv(
			m_fbo_valid, GL_COLOR_ATTACHMENT1, GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, return_values_dummy_storage);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "GetNamedFramebufferAttachmentParameteriv",
							 "the value of FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE is GL_NONE and pname is not "
							 "FRAMEBUFFER_ATTACHMENT_OBJECT_NAME or FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE.");

		/*  Check that INVALID_OPERATION is generated by
		 GetNamedFramebufferAttachmentParameteriv if attachment is
		 DEPTH_STENCIL_ATTACHMENT and pname is FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE. */
		gl.getNamedFramebufferAttachmentParameteriv(m_fbo_valid, GL_DEPTH_STENCIL_ATTACHMENT,
													GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE,
													return_values_dummy_storage);

		is_ok &=
			ExpectError(GL_INVALID_OPERATION, "GetNamedFramebufferAttachmentParameteriv",
						"attachment is DEPTH_STENCIL_ATTACHMENT and pname is FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE.");

		/*  Check that an INVALID_ENUM error is generated if the default framebuffer is
		 queried and attachment is not one the values FRONT, FRONT_LEFT, FRONT_RIGHT,
		 BACK, BACK_LEFT, BACK_RIGHT, DEPTH, STENCIL. */
		gl.getNamedFramebufferAttachmentParameteriv(
			0, m_default_attachment_invalid, GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, return_values_dummy_storage);

		is_ok &= ExpectError(GL_INVALID_ENUM, "GetNamedFramebufferAttachmentParameteriv",
							 "the default framebuffer is queried and attachment is not one the values FRONT, "
							 "FRONT_LEFT, FRONT_RIGHT, BACK, BACK_LEFT, BACK_RIGHT, DEPTH, STENCIL.");

		/*  Check that an INVALID_OPERATION error is generated if a framebuffer object is
		 bound to target and attachment is COLOR_ATTACHMENTm where m is greater than or
		 equal to the value of MAX_COLOR_ATTACHMENTS. */
		gl.getNamedFramebufferAttachmentParameteriv(m_fbo_valid, GL_COLOR_ATTACHMENT0 + m_max_color_attachments,
													GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE,
													return_values_dummy_storage);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "GetNamedFramebufferAttachmentParameteriv",
							 "a framebuffer object is bound to target and attachment is COLOR_ATTACHMENTm where m is "
							 "equal to the value of MAX_COLOR_ATTACHMENTS.");

		gl.getNamedFramebufferAttachmentParameteriv(m_fbo_valid, GL_COLOR_ATTACHMENT0 + m_max_color_attachments + 1,
													GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE,
													return_values_dummy_storage);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "GetNamedFramebufferAttachmentParameteriv",
							 "a framebuffer object is bound to target and attachment is COLOR_ATTACHMENTm where m is "
							 "greater than the value of MAX_COLOR_ATTACHMENTS.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}